

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
bulk_load(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
          *this,V *values,int num_keys,LinearModel<int> *pretrained_model,bool train_with_sample)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  double *pdVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int *piVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar24 [16];
  
  initialize(this,num_keys,0.7);
  if (num_keys == 0) {
    iVar15 = this->data_capacity_;
    this->expansion_threshold_ = (double)iVar15;
    this->contraction_threshold_ = 0.0;
    piVar18 = this->key_slots_;
    for (lVar10 = 0; lVar10 < iVar15; lVar10 = lVar10 + 1) {
      piVar18[lVar10] = 0x7fffffff;
      iVar15 = this->data_capacity_;
    }
  }
  else {
    if (pretrained_model == (LinearModel<int> *)0x0) {
      pretrained_model = &(this->super_AlexNode<int,_int>).model_;
      build_model(values,num_keys,pretrained_model,train_with_sample);
      pdVar8 = &(this->super_AlexNode<int,_int>).model_.b_;
    }
    else {
      pdVar8 = &pretrained_model->b_;
    }
    uVar13 = (ulong)(uint)num_keys;
    dVar19 = (double)this->data_capacity_ / (double)num_keys;
    dVar1 = *pdVar8;
    piVar18 = &values->second;
    (this->super_AlexNode<int,_int>).model_.a_ = dVar19 * pretrained_model->a_;
    (this->super_AlexNode<int,_int>).model_.b_ = dVar19 * dVar1;
    iVar15 = -1;
    uVar17 = 0;
    uVar14 = num_keys;
    do {
      if (uVar17 == (uint)(~(num_keys >> 0x1f) & num_keys)) break;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
      iVar3 = values[uVar17].first;
      iVar4 = this->data_capacity_;
      iVar9 = iVar15 + 1;
      auVar22._0_8_ = (double)iVar3;
      auVar22._8_8_ = in_XMM2_Qb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
      auVar2 = vfmadd213sd_fma(auVar22,auVar20,auVar2);
      iVar15 = (int)auVar2._0_8_;
      if ((int)auVar2._0_8_ < iVar9) {
        iVar15 = iVar9;
      }
      iVar11 = iVar4 - iVar15;
      if (iVar11 < (int)uVar14) {
        piVar5 = this->key_slots_;
        for (lVar10 = (long)iVar9; lVar10 < (int)(iVar4 - uVar14); lVar10 = lVar10 + 1) {
          piVar5[lVar10] = iVar3;
        }
        for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
          this->key_slots_[((long)iVar4 + uVar16) - (long)(int)uVar14] = piVar18[uVar16 * 2 + -1];
          this->payload_slots_[((long)iVar4 + uVar16) - (long)(int)uVar14] = piVar18[uVar16 * 2];
          set_bit(this,(iVar4 - uVar14) + (int)uVar16);
        }
        iVar15 = (int)uVar16 + iVar4 + ~uVar14;
        uVar7 = uVar14;
      }
      else {
        piVar5 = this->key_slots_;
        lVar10 = (long)iVar15;
        for (lVar12 = (long)iVar9; lVar12 < lVar10; lVar12 = lVar12 + 1) {
          piVar5[lVar12] = iVar3;
        }
        this->key_slots_[lVar10] = iVar3;
        this->payload_slots_[lVar10] = values[uVar17].second;
        set_bit(this,iVar15);
        uVar7 = uVar14 - 1;
      }
      uVar17 = uVar17 + 1;
      uVar13 = uVar13 - 1;
      piVar18 = piVar18 + 2;
      bVar6 = (int)uVar14 <= iVar11;
      uVar14 = uVar7;
    } while (bVar6);
    piVar18 = this->key_slots_;
    lVar10 = (long)iVar15;
    while( true ) {
      lVar10 = lVar10 + 1;
      if (this->data_capacity_ <= lVar10) break;
      piVar18[lVar10] = 0x7fffffff;
    }
    auVar21._0_8_ = (double)this->data_capacity_;
    auVar21._8_8_ = in_XMM2_Qb;
    auVar24._0_8_ = (double)(num_keys + 1);
    auVar24._8_8_ = in_XMM2_Qb;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar21._0_8_ * 0.8;
    auVar2 = vmaxsd_avx(auVar24,auVar23);
    auVar2 = vminsd_avx(auVar21,auVar2);
    this->expansion_threshold_ = auVar2._0_8_;
    this->contraction_threshold_ = auVar21._0_8_ * 0.6;
    this->min_key_ = values->first;
    this->max_key_ = values[(long)num_keys + -1].first;
  }
  return;
}

Assistant:

void bulk_load(const V values[], int num_keys,
                 const LinearModel<T>* pretrained_model = nullptr,
                 bool train_with_sample = false) {
    initialize(num_keys, kInitDensity_);

    if (num_keys == 0) {
      expansion_threshold_ = data_capacity_;
      contraction_threshold_ = 0;
      for (int i = 0; i < data_capacity_; i++) {
        ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
      }
      return;
    }

    // Build model
    if (pretrained_model != nullptr) {
      this->model_.a_ = pretrained_model->a_;
      this->model_.b_ = pretrained_model->b_;
    } else {
      build_model(values, num_keys, &(this->model_), train_with_sample);
    }
    this->model_.expand(static_cast<double>(data_capacity_) / num_keys);

    // Model-based inserts
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int position = this->model_.predict(values[i].first);
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = data_capacity_ - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = data_capacity_ - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
          ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
        }
        for (int j = i; j < num_keys; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          key_slots_[pos] = values[j].first;
          payload_slots_[pos] = values[j].second;
#else
          data_slots_[pos] = values[j];
#endif
          set_bit(pos);
          pos++;
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
        ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      key_slots_[position] = values[i].first;
      payload_slots_[position] = values[i].second;
#else
      data_slots_[position] = values[i];
#endif
      set_bit(position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < data_capacity_; i++) {
      ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
    }

    expansion_threshold_ = std::min(std::max(data_capacity_ * kMaxDensity_,
                                             static_cast<double>(num_keys + 1)),
                                    static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
    min_key_ = values[0].first;
    max_key_ = values[num_keys - 1].first;
  }